

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigSimulateOneSim(Ivy_FraigMan_t *p)

{
  abctime aVar1;
  abctime aVar2;
  abctime clk;
  Ivy_FraigSim_t *pSims;
  Ivy_FraigMan_t *p_local;
  
  aVar1 = Abc_Clock();
  for (clk = (abctime)p->pSimStart; clk != 0; clk = *(abctime *)(clk + 8)) {
    Ivy_NodeSimulateSim(p,(Ivy_FraigSim_t *)clk);
  }
  aVar2 = Abc_Clock();
  p->timeSim = (aVar2 - aVar1) + p->timeSim;
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Ivy_FraigSimulateOneSim( Ivy_FraigMan_t * p )
{
    Ivy_FraigSim_t * pSims;
    abctime clk;
clk = Abc_Clock();
    for ( pSims = p->pSimStart; pSims; pSims = pSims->pNext )
        Ivy_NodeSimulateSim( p, pSims );
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}